

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

void __thiscall
HighsHashTable<MatrixRow,_int>::~HighsHashTable(HighsHashTable<MatrixRow,_int> *this)

{
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&this->metadata);
  std::unique_ptr<HighsHashTableEntry<MatrixRow,_int>,_HighsHashTable<MatrixRow,_int>::OpNewDeleter>
  ::~unique_ptr(&this->entries);
  return;
}

Assistant:

~HighsHashTable() {
    if (!std::is_trivially_destructible<Entry>::value && metadata) {
      u64 capacity = tableSizeMask + 1;
      for (u64 i = 0; i < capacity; ++i) {
        if (occupied(metadata[i])) entries.get()[i].~Entry();
      }
    }
  }